

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int32_t iVar24;
  BreakpointSource BVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  Breakpoint *pBVar32;
  bool bVar33;
  type t;
  Breakpoint local_188;
  Breakpoint local_128;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  lVar28 = 2;
  do {
    iVar2 = SPxShellsort<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::BreakpointCompare>
            ::incs[lVar28];
    lVar29 = (long)start + (long)iVar2;
    lVar31 = lVar29;
    iVar30 = start;
    if ((int)lVar29 <= end) {
      do {
        uVar9 = *(undefined8 *)keys[lVar31].val.m_backend.data._M_elems;
        uVar10 = *(undefined8 *)(keys[lVar31].val.m_backend.data._M_elems + 2);
        puVar1 = keys[lVar31].val.m_backend.data._M_elems + 4;
        uVar11 = *(undefined8 *)puVar1;
        uVar12 = *(undefined8 *)(puVar1 + 2);
        puVar1 = keys[lVar31].val.m_backend.data._M_elems + 8;
        uVar13 = *(undefined8 *)puVar1;
        uVar14 = *(undefined8 *)(puVar1 + 2);
        puVar1 = keys[lVar31].val.m_backend.data._M_elems + 0xc;
        uVar15 = *(undefined8 *)puVar1;
        uVar16 = *(undefined8 *)(puVar1 + 2);
        iVar3 = keys[lVar31].val.m_backend.exp;
        bVar33 = keys[lVar31].val.m_backend.neg;
        fVar4 = keys[lVar31].val.m_backend.fpclass;
        iVar5 = keys[lVar31].val.m_backend.prec_elem;
        uVar6._0_4_ = keys[lVar31].idx;
        uVar6._4_4_ = keys[lVar31].src;
        iVar27 = (int)lVar31;
        iVar8 = iVar30;
        if (lVar29 <= lVar31) {
          do {
            local_128.val.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)keys[iVar8].val.m_backend.data._M_elems;
            local_128.val.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(keys[iVar8].val.m_backend.data._M_elems + 2);
            puVar1 = keys[iVar8].val.m_backend.data._M_elems + 4;
            local_128.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_128.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = keys[iVar8].val.m_backend.data._M_elems + 8;
            local_128.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_128.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = keys[iVar8].val.m_backend.data._M_elems + 0xc;
            local_128.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            local_128.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
            local_128.val.m_backend.exp = keys[iVar8].val.m_backend.exp;
            local_128.val.m_backend.neg = keys[iVar8].val.m_backend.neg;
            local_128.val.m_backend.fpclass = keys[iVar8].val.m_backend.fpclass;
            local_128.val.m_backend.prec_elem = keys[iVar8].val.m_backend.prec_elem;
            local_128.idx = keys[iVar8].idx;
            local_128.src = keys[iVar8].src;
            local_188.val.m_backend.data._M_elems._0_8_ = uVar9;
            local_188.val.m_backend.data._M_elems._8_8_ = uVar10;
            local_188.val.m_backend.data._M_elems._16_8_ = uVar11;
            local_188.val.m_backend.data._M_elems._24_8_ = uVar12;
            local_188.val.m_backend.data._M_elems._32_8_ = uVar13;
            local_188.val.m_backend.data._M_elems._40_8_ = uVar14;
            local_188.val.m_backend.data._M_elems._48_8_ = uVar15;
            local_188.val.m_backend.data._M_elems._56_8_ = uVar16;
            local_188.val.m_backend.exp = iVar3;
            local_188.val.m_backend.neg = bVar33;
            local_188.val.m_backend.fpclass = fVar4;
            local_188.val.m_backend.prec_elem = iVar5;
            local_188._80_8_ = uVar6;
            SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::BreakpointCompare::operator()
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_d0,compare,&local_188,&local_128);
            iVar27 = iVar8;
            if (local_d0.fpclass == cpp_dec_float_NaN) break;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
            iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_d0,&local_80);
            if (-1 < iVar26) break;
            iVar27 = iVar2 + iVar8;
            pBVar32 = keys + iVar8;
            uVar17 = *(undefined8 *)(pBVar32->val).m_backend.data._M_elems;
            uVar18 = *(undefined8 *)((pBVar32->val).m_backend.data._M_elems + 2);
            uVar19 = *(undefined8 *)((pBVar32->val).m_backend.data._M_elems + 4);
            uVar20 = *(undefined8 *)((pBVar32->val).m_backend.data._M_elems + 6);
            uVar21 = *(undefined8 *)((pBVar32->val).m_backend.data._M_elems + 8);
            uVar22 = *(undefined8 *)((pBVar32->val).m_backend.data._M_elems + 10);
            uVar23 = *(undefined8 *)((pBVar32->val).m_backend.data._M_elems + 0xe);
            puVar1 = keys[iVar27].val.m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar1 = *(undefined8 *)((pBVar32->val).m_backend.data._M_elems + 0xc);
            *(undefined8 *)(puVar1 + 2) = uVar23;
            puVar1 = keys[iVar27].val.m_backend.data._M_elems + 8;
            *(undefined8 *)puVar1 = uVar21;
            *(undefined8 *)(puVar1 + 2) = uVar22;
            puVar1 = keys[iVar27].val.m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = uVar19;
            *(undefined8 *)(puVar1 + 2) = uVar20;
            *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems = uVar17;
            *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2) = uVar18;
            keys[iVar27].val.m_backend.exp = (pBVar32->val).m_backend.exp;
            keys[iVar27].val.m_backend.neg = (pBVar32->val).m_backend.neg;
            iVar24 = (pBVar32->val).m_backend.prec_elem;
            keys[iVar27].val.m_backend.fpclass = (pBVar32->val).m_backend.fpclass;
            keys[iVar27].val.m_backend.prec_elem = iVar24;
            BVar25 = pBVar32->src;
            keys[iVar27].idx = pBVar32->idx;
            keys[iVar27].src = BVar25;
            iVar27 = iVar8 - iVar2;
            bVar7 = (int)lVar29 <= iVar8;
            iVar8 = iVar27;
          } while (bVar7);
          iVar27 = iVar27 + iVar2;
        }
        puVar1 = keys[iVar27].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar1 = uVar15;
        *(undefined8 *)(puVar1 + 2) = uVar16;
        puVar1 = keys[iVar27].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar1 = uVar13;
        *(undefined8 *)(puVar1 + 2) = uVar14;
        puVar1 = keys[iVar27].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = uVar11;
        *(undefined8 *)(puVar1 + 2) = uVar12;
        *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems = uVar9;
        *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2) = uVar10;
        keys[iVar27].val.m_backend.exp = iVar3;
        keys[iVar27].val.m_backend.neg = bVar33;
        keys[iVar27].val.m_backend.fpclass = fVar4;
        keys[iVar27].val.m_backend.prec_elem = iVar5;
        keys[iVar27].idx = (int)uVar6;
        keys[iVar27].src = uVar6._4_4_;
        lVar31 = lVar31 + 1;
        iVar30 = iVar30 + 1;
      } while (end + 1 != (int)lVar31);
    }
    bVar33 = lVar28 == 0;
    lVar28 = lVar28 + -1;
    if (bVar33) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}